

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeSpan.h
# Opt level: O3

string * __thiscall
libsgp4::TimeSpan::ToString_abi_cxx11_(string *__return_storage_ptr__,TimeSpan *this)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  stringstream ss;
  undefined1 auStack_1b8 [15];
  char local_1a9;
  stringstream local_1a8 [16];
  long local_198 [2];
  undefined8 uStack_188;
  uint auStack_180 [22];
  ios_base local_128 [112];
  char acStack_b8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffff4f | 0x80;
  lVar3 = *(long *)(local_198[0] + -0x18);
  if (acStack_b8[lVar3 + 1] == '\0') {
    std::ios::widen((char)auStack_1b8 + (char)lVar3 + ' ');
    acStack_b8[lVar3 + 1] = '\x01';
  }
  acStack_b8[lVar3] = '0';
  lVar3 = this->m_ticks;
  if (lVar3 < 0) {
    local_1a9 = '-';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1a9,1);
    lVar3 = this->m_ticks;
  }
  if (0x283baebffe < lVar3 + 86399999999U) {
    iVar5 = (int)(lVar3 / 86400000000);
    *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
    iVar4 = -iVar5;
    if (0 < iVar5) {
      iVar4 = iVar5;
    }
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_198,iVar4);
    local_1a9 = '.';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
    lVar3 = this->m_ticks;
  }
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  auVar1 = SEXT816(lVar3 % 86400000000) * ZEXT816(0x98b5bf2c03e529c5);
  iVar4 = (int)(auVar1._8_8_ >> 0x1f) - (auVar1._12_4_ >> 0x1f);
  iVar5 = -iVar4;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_198,iVar5);
  local_1a9 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  auVar1 = SEXT816(this->m_ticks % 3600000000) * ZEXT816(0x8f2a633943a6d729);
  iVar4 = (int)(auVar1._8_8_ >> 0x19) - (auVar1._12_4_ >> 0x1f);
  iVar5 = -iVar4;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_198,iVar5);
  local_1a9 = ':';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1a9,1);
  *(undefined8 *)((long)&uStack_188 + *(long *)(local_198[0] + -0x18)) = 2;
  auVar1 = SEXT816(this->m_ticks) * ZEXT816(0x8f2a633943a6d729);
  iVar5 = ((int)this->m_ticks + ((int)(auVar1._8_8_ >> 0x19) - (auVar1._12_4_ >> 0x1f)) * -60000000)
          / 1000000;
  iVar4 = -iVar5;
  if (0 < iVar5) {
    iVar4 = iVar5;
  }
  std::ostream::operator<<((ostream *)local_198,iVar4);
  lVar3 = this->m_ticks * 0x790fb65668c26139;
  if (0x10c6f7a0b5ec < (lVar3 + 0x218def416bd80U >> 6 | lVar3 << 0x3a)) {
    local_1a9 = '.';
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,&local_1a9,1);
    *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 6;
    auVar1 = SEXT816(this->m_ticks) * SEXT816(0x431bde82d7b634db);
    iVar4 = (int)this->m_ticks + ((int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f)) * -1000000;
    iVar5 = -iVar4;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    std::ostream::operator<<((ostream *)poVar2,iVar5);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;

        ss << std::right << std::setfill('0');
        
        if (m_ticks < 0)
        {
            ss << '-';
        }

        if (Days() != 0)
        {
            ss << std::setw(2) << std::abs(Days()) << '.';
        }

        ss << std::setw(2) << std::abs(Hours()) << ':';
        ss << std::setw(2) << std::abs(Minutes()) << ':';
        ss << std::setw(2) << std::abs(Seconds());

        if (Microseconds() != 0)
        {
            ss << '.' << std::setw(6) << std::abs(Microseconds());
        }

        return ss.str();
    }